

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O0

size_t int_tcfg_list(size_t maxItems,TRUN_ConfigItem *outArray)

{
  TRUN_ConfigItem *pTVar1;
  TRUN_ConfigItem *local_48;
  TRUN_ConfigItem *local_40;
  size_t i;
  size_t nToCopy;
  TRUN_ConfigItem *glb_config;
  size_t nGlbItems;
  TRUN_ConfigItem *outArray_local;
  size_t maxItems_local;
  
  glb_config = (TRUN_ConfigItem *)0x0;
  nGlbItems = (size_t)outArray;
  outArray_local = (TRUN_ConfigItem *)maxItems;
  pTVar1 = get_config_items((size_t *)&glb_config);
  if (nGlbItems == 0) {
    maxItems_local = (size_t)glb_config;
  }
  else {
    if (outArray_local < glb_config) {
      local_48 = outArray_local;
    }
    else {
      local_48 = glb_config;
    }
    for (local_40 = (TRUN_ConfigItem *)0x0; local_40 < local_48;
        local_40 = (TRUN_ConfigItem *)local_40->name) {
      memcpy((void *)(nGlbItems + (long)local_40 * 0x30),pTVar1 + (long)local_40,0x30);
    }
    maxItems_local = (size_t)local_48;
  }
  return maxItems_local;
}

Assistant:

static size_t int_tcfg_list(size_t maxItems, TRUN_ConfigItem *outArray) {
    // Return number of items available

    size_t nGlbItems = 0;
    auto glb_config = get_config_items(&nGlbItems);

    if (outArray == nullptr) {
        return nGlbItems;
    }

    size_t nToCopy = (maxItems<nGlbItems)?maxItems:nGlbItems;
    for(size_t i=0;i<nToCopy;i++) {
        outArray[i] = glb_config[i];
    }
    return nToCopy;
}